

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linecontext.cpp
# Opt level: O3

int __thiscall LineContext::init(LineContext *this,EVP_PKEY_CTX *ctx)

{
  Data *pDVar1;
  int *piVar2;
  QArrayData *pQVar3;
  char cVar4;
  int in_EAX;
  QString *data;
  ulong uVar5;
  long lVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  QFileInfo info;
  QString ext;
  QArrayDataPointer<QString> local_d8;
  QFileInfo local_b8 [8];
  QArrayDataPointer<QString> local_b0;
  QArrayData *local_98;
  QString *pQStack_90;
  qsizetype local_88;
  QArrayData *local_80;
  QString *pQStack_78;
  qsizetype local_70;
  QArrayData *local_68;
  QString *pQStack_60;
  qsizetype local_58;
  QArrayData *local_50;
  QString *pQStack_48;
  qsizetype local_40;
  QString *local_38;
  qsizetype qStack_30;
  
  if (this->mInit == false) {
    this->mInit = true;
    QFileInfo::QFileInfo(local_b8,(QString *)ctx);
    QVar7.m_data = (storage_type *)0x3;
    QVar7.m_size = (qsizetype)&local_d8;
    QString::fromUtf8(QVar7);
    local_98 = &(local_d8.d)->super_QArrayData;
    pQStack_90 = local_d8.ptr;
    local_88 = local_d8.size;
    QVar8.m_data = (storage_type *)0x3;
    QVar8.m_size = (qsizetype)&local_d8;
    QString::fromUtf8(QVar8);
    local_80 = &(local_d8.d)->super_QArrayData;
    pQStack_78 = local_d8.ptr;
    local_70 = local_d8.size;
    QVar9.m_data = (storage_type *)0x1;
    QVar9.m_size = (qsizetype)&local_d8;
    QString::fromUtf8(QVar9);
    local_68 = &(local_d8.d)->super_QArrayData;
    pQStack_60 = local_d8.ptr;
    local_58 = local_d8.size;
    QVar10.m_data = (storage_type *)0x3;
    QVar10.m_size = (qsizetype)&local_d8;
    QString::fromUtf8(QVar10);
    local_50 = &(local_d8.d)->super_QArrayData;
    pQStack_48 = local_d8.ptr;
    local_40 = local_d8.size;
    local_b0.ptr = (QString *)QArrayData::allocate((QArrayData **)&local_b0,0x18,8,4,KeepSize);
    local_b0.size = 0;
    uVar5 = 0xffffffffffffffe8;
    do {
      pDVar1 = *(Data **)((long)&local_80 + uVar5);
      local_b0.ptr[local_b0.size].d.d = pDVar1;
      local_b0.ptr[local_b0.size].d.ptr = *(char16_t **)((long)&pQStack_78 + uVar5);
      local_b0.ptr[local_b0.size].d.size = *(qsizetype *)((long)&local_70 + uVar5);
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_b0.size = local_b0.size + 1;
      uVar5 = uVar5 + 0x18;
    } while (uVar5 < 0x48);
    lVar6 = 0x48;
    do {
      piVar2 = *(int **)((long)&local_98 + lVar6);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate(*(QArrayData **)((long)&local_98 + lVar6),2,8);
        }
      }
      lVar6 = lVar6 + -0x18;
    } while (lVar6 != -0x18);
    QVar11.m_data = (storage_type *)0x2;
    QVar11.m_size = (qsizetype)&local_98;
    QString::fromUtf8(QVar11);
    pQVar3 = local_98;
    local_38 = pQStack_90;
    qStack_30 = local_88;
    local_d8.ptr = (QString *)QArrayData::allocate((QArrayData **)&local_d8,0x18,8,1,KeepSize);
    ((local_d8.ptr)->d).d = (Data *)pQVar3;
    ((local_d8.ptr)->d).ptr = (char16_t *)local_38;
    ((local_d8.ptr)->d).size = qStack_30;
    if (pQVar3 == (QArrayData *)0x0) {
      local_d8.size = 1;
    }
    else {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_d8.size = 1;
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,8);
      }
    }
    QFileInfo::suffix();
    QVar12.m_data = (storage_type_conflict *)pQStack_90;
    QVar12.m_size = local_88;
    cVar4 = QtPrivate::QStringList_contains((QList *)&local_b0,QVar12,CaseSensitive);
    if (cVar4 != '\0') {
      parseCpp(this,(QString *)ctx);
    }
    QVar13.m_data = (storage_type_conflict *)pQStack_90;
    QVar13.m_size = local_88;
    cVar4 = QtPrivate::QStringList_contains((QList *)&local_d8,QVar13,CaseSensitive);
    if (cVar4 != '\0') {
      parsePython(this,(QString *)ctx);
    }
    if (local_98 != (QArrayData *)0x0) {
      LOCK();
      (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_98,2,8);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_d8);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_b0);
    in_EAX = QFileInfo::~QFileInfo(local_b8);
  }
  return in_EAX;
}

Assistant:

void LineContext::init(const QString &path)
{
    if (mInit) {
        return;
    }
    mInit = true;

    QFileInfo info(path);

    QStringList cpp = {"cpp", "cxx", "h", "hpp"};
    QStringList py = {"py"};

    QString ext = info.suffix();

    if (cpp.contains(ext)) {
        parseCpp(path);
    }
    if (py.contains(ext)) {
        parsePython(path);
    }
}